

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_get_preview_raw_frame(AV1_COMP *cpi,YV12_BUFFER_CONFIG *dest)

{
  undefined4 *in_RSI;
  long in_RDI;
  int ret;
  AV1_COMMON *cm;
  int local_24;
  int local_4;
  
  if (*(int *)(in_RDI + 0x3c160) == 0) {
    local_4 = -1;
  }
  else {
    if ((*(long *)(in_RDI + 0x3c068) == 0) || ((*(byte *)(in_RDI + 0x42368) & 1) != 0)) {
      local_24 = -1;
    }
    else {
      memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x3c068) + 0x4e0),0xd0);
      *in_RSI = *(undefined4 *)(in_RDI + 0x3bfb8);
      in_RSI[2] = *(undefined4 *)(in_RDI + 0x3bfbc);
      in_RSI[1] = *(int *)(in_RDI + 0x3bfb8) >>
                  ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 0x60) & 0x1f);
      in_RSI[3] = *(int *)(in_RDI + 0x3bfbc) >>
                  ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x42008) + 100) & 0x1f);
      local_24 = 0;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int av1_get_preview_raw_frame(AV1_COMP *cpi, YV12_BUFFER_CONFIG *dest) {
  AV1_COMMON *cm = &cpi->common;
  if (!cm->show_frame) {
    return -1;
  } else {
    int ret;
    if (cm->cur_frame != NULL && !cpi->oxcf.algo_cfg.skip_postproc_filtering) {
      *dest = cm->cur_frame->buf;
      dest->y_width = cm->width;
      dest->y_height = cm->height;
      dest->uv_width = cm->width >> cm->seq_params->subsampling_x;
      dest->uv_height = cm->height >> cm->seq_params->subsampling_y;
      ret = 0;
    } else {
      ret = -1;
    }
    return ret;
  }
}